

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void set_insert_node_hash(lyxp_set *set,lyd_node *node,lyxp_node_type type)

{
  uint32_t uVar1;
  LY_ERR LVar2;
  ly_ht *plVar3;
  long lVar4;
  ulong uVar5;
  lyxp_set_hash_node hnode;
  lyd_node *local_40;
  lyxp_node_type local_38 [2];
  
  if (set->ht == (ly_ht *)0x0) {
    if (set->used < 4) {
      return;
    }
    plVar3 = lyht_new(1,0xc,set_values_equal_cb,(void *)0x0,1);
    set->ht = plVar3;
    if (set->used != 0) {
      lVar4 = 8;
      uVar5 = 0;
      do {
        local_40 = *(lyd_node **)((long)(set->val).nodes + lVar4 + -8);
        local_38[0] = *(lyxp_node_type *)((long)&((set->val).nodes)->node + lVar4);
        uVar1 = lyht_hash_multi(0,(char *)&local_40,8);
        uVar1 = lyht_hash_multi(uVar1,(char *)local_38,4);
        uVar1 = lyht_hash_multi(uVar1,(char *)0x0,0);
        LVar2 = lyht_insert(set->ht,&local_40,uVar1,(void **)0x0);
        if (LVar2 != LY_SUCCESS) {
          __assert_fail("!r",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x2f0,
                        "void set_insert_node_hash(struct lyxp_set *, struct lyd_node *, enum lyxp_node_type)"
                       );
        }
        if ((local_40 == node) && (local_38[0] == type)) {
          return;
        }
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < set->used);
      plVar3 = set->ht;
    }
    if (plVar3 == (ly_ht *)0x0) {
      return;
    }
  }
  local_40 = node;
  local_38[0] = type;
  uVar1 = lyht_hash_multi(0,(char *)&local_40,8);
  uVar1 = lyht_hash_multi(uVar1,(char *)local_38,4);
  uVar1 = lyht_hash_multi(uVar1,(char *)0x0,0);
  LVar2 = lyht_insert(set->ht,&local_40,uVar1,(void **)0x0);
  if (LVar2 == LY_SUCCESS) {
    return;
  }
  __assert_fail("!r",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x304,
                "void set_insert_node_hash(struct lyxp_set *, struct lyd_node *, enum lyxp_node_type)"
               );
}

Assistant:

static void
set_insert_node_hash(struct lyxp_set *set, struct lyd_node *node, enum lyxp_node_type type)
{
    LY_ERR r;
    uint32_t i, hash;
    struct lyxp_set_hash_node hnode;

    if (!set->ht && (set->used >= LYD_HT_MIN_ITEMS)) {
        /* create hash table and add all the nodes */
        set->ht = lyht_new(1, sizeof(struct lyxp_set_hash_node), set_values_equal_cb, NULL, 1);
        for (i = 0; i < set->used; ++i) {
            hnode.node = set->val.nodes[i].node;
            hnode.type = set->val.nodes[i].type;

            hash = lyht_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
            hash = lyht_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
            hash = lyht_hash_multi(hash, NULL, 0);

            r = lyht_insert(set->ht, &hnode, hash, NULL);
            assert(!r);
            (void)r;

            if ((hnode.node == node) && (hnode.type == type)) {
                /* it was just added, do not add it twice */
                return;
            }
        }
    }

    if (set->ht) {
        /* add the new node into hash table */
        hnode.node = node;
        hnode.type = type;

        hash = lyht_hash_multi(0, (const char *)&hnode.node, sizeof hnode.node);
        hash = lyht_hash_multi(hash, (const char *)&hnode.type, sizeof hnode.type);
        hash = lyht_hash_multi(hash, NULL, 0);

        r = lyht_insert(set->ht, &hnode, hash, NULL);
        assert(!r);
        (void)r;
    }
}